

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool execAdbCommand(QStringList *args,QByteArray *output,bool verbose)

{
  Data *pDVar1;
  int *piVar2;
  QString *b;
  QString *data;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QByteArrayView QVar6;
  QArrayData *d;
  QArrayDataPointer<QString> local_a8;
  QArrayData *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  QArrayData *local_68 [3];
  Data *local_50;
  char16_t *local_48;
  qsizetype aqStack_40 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (g_options.serial.d.size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      bVar5 = execCommand(&g_options.adbCommand,args,output,verbose);
      return bVar5;
    }
  }
  else {
    local_a8.size = -0x5555555555555556;
    local_a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a8.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    QVar6.m_data = (storage_type *)0x2;
    QVar6.m_size = (qsizetype)&local_88;
    QString::fromLatin1(QVar6);
    local_68[0] = local_88;
    local_68[1] = (QArrayData *)uStack_80;
    local_68[2] = (QArrayData *)local_78;
    local_50 = g_options.serial.d.d;
    local_48 = g_options.serial.d.ptr;
    aqStack_40[0] = g_options.serial.d.size;
    if (g_options.serial.d.d != (Data *)0x0) {
      LOCK();
      ((g_options.serial.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((g_options.serial.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_88 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
    local_a8.ptr = (QString *)QArrayData::allocate(&local_88,0x18,0x10,2,KeepSize);
    local_a8.d = (Data *)local_88;
    local_a8.size = 0;
    uVar3 = 0xffffffffffffffe8;
    do {
      pDVar1 = *(Data **)((long)&local_50 + uVar3);
      local_a8.ptr[local_a8.size].d.d = pDVar1;
      local_a8.ptr[local_a8.size].d.ptr = *(char16_t **)((long)aqStack_40 + (uVar3 - 8));
      local_a8.ptr[local_a8.size].d.size = *(qsizetype *)((long)aqStack_40 + uVar3);
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_a8.size = local_a8.size + 1;
      bVar5 = 0xffffffffffffffe7 < uVar3;
      uVar3 = uVar3 + 0x18;
    } while (bVar5);
    lVar4 = 0x18;
    do {
      piVar2 = *(int **)((long)local_68 + lVar4);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate(*(QArrayData **)((long)local_68 + lVar4),2,0x10);
        }
      }
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != -0x18);
    b = (args->d).ptr;
    QtPrivate::QCommonArrayOps<QString>::growAppend
              ((QCommonArrayOps<QString> *)&local_a8,b,b + (args->d).size);
    bVar5 = execCommand(&g_options.adbCommand,(QStringList *)&local_a8,output,verbose);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return bVar5;
    }
  }
  __stack_chk_fail();
}

Assistant:

static bool execAdbCommand(const QStringList &args, QByteArray *output = nullptr,
                           bool verbose = true)
{
    if (g_options.serial.isEmpty())
        return execCommand(g_options.adbCommand, args, output, verbose);

    QStringList argsWithSerial = {"-s"_L1, g_options.serial};
    argsWithSerial.append(args);

    return execCommand(g_options.adbCommand, argsWithSerial, output, verbose);
}